

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugMacro.cpp
# Opt level: O1

void __thiscall llvm::DWARFDebugMacro::dump(DWARFDebugMacro *this,raw_ostream *OS)

{
  uint uVar1;
  ulong uVar2;
  raw_ostream *prVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  StringRef SVar7;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  WithColor local_60;
  uint *local_50;
  pointer local_48;
  pointer local_40;
  byte local_31;
  
  local_48 = (this->MacroLists).
             super__Vector_base<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->MacroLists).
             super__Vector_base<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48 != local_40) {
    iVar4 = 0;
    do {
      uVar2 = (ulong)(local_48->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
                     super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                     super_SmallVectorBase.Size;
      if (uVar2 != 0) {
        puVar6 = (uint *)(local_48->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
                         super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
                         super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                         super_SmallVectorBase.BeginX;
        local_50 = puVar6 + uVar2 * 6;
        do {
          if (iVar4 == 0) {
            iVar4 = 0;
            iVar5 = iVar4;
          }
          else {
            iVar4 = iVar4 - (uint)(*puVar6 == 4);
            iVar5 = iVar4;
          }
          for (; iVar4 != 0; iVar4 = iVar4 + -1) {
            SVar7.Length = 2;
            SVar7.Data = "  ";
            raw_ostream::operator<<(OS,SVar7);
          }
          local_31 = *puVar6 == 3;
          WithColor::WithColor(&local_60,OS,Macro,false);
          prVar3 = local_60.OS;
          SVar7 = dwarf::MacinfoString(*puVar6);
          raw_ostream::operator<<(prVar3,SVar7);
          WithColor::~WithColor(&local_60);
          uVar1 = *puVar6;
          if (uVar1 - 1 < 2) {
            Str_01.Length = 0xb;
            Str_01.Data = " - lineno: ";
            prVar3 = raw_ostream::operator<<(OS,Str_01);
            raw_ostream::operator<<(prVar3,*(unsigned_long *)(puVar6 + 2));
            Str_02.Length = 8;
            Str_02.Data = " macro: ";
            prVar3 = raw_ostream::operator<<(OS,Str_02);
            raw_ostream::operator<<(prVar3,*(char **)(puVar6 + 4));
          }
          else if (uVar1 == 3) {
            Str_03.Length = 0xb;
            Str_03.Data = " - lineno: ";
            prVar3 = raw_ostream::operator<<(OS,Str_03);
            raw_ostream::operator<<(prVar3,*(unsigned_long *)(puVar6 + 2));
            Str_04.Length = 10;
            Str_04.Data = " filenum: ";
            prVar3 = raw_ostream::operator<<(OS,Str_04);
            raw_ostream::operator<<(prVar3,*(unsigned_long *)(puVar6 + 4));
          }
          else if (uVar1 == 0xff) {
            Str.Length = 0xd;
            Str.Data = " - constant: ";
            prVar3 = raw_ostream::operator<<(OS,Str);
            raw_ostream::operator<<(prVar3,*(unsigned_long *)(puVar6 + 2));
            Str_00.Length = 9;
            Str_00.Data = " string: ";
            prVar3 = raw_ostream::operator<<(OS,Str_00);
            raw_ostream::operator<<(prVar3,*(char **)(puVar6 + 4));
          }
          iVar4 = iVar5 + (uint)local_31;
          Str_05.Length = 1;
          Str_05.Data = "\n";
          raw_ostream::operator<<(OS,Str_05);
          puVar6 = puVar6 + 6;
        } while (puVar6 != local_50);
      }
      Str_06.Length = 1;
      Str_06.Data = "\n";
      raw_ostream::operator<<(OS,Str_06);
      local_48 = local_48 + 1;
    } while (local_48 != local_40);
  }
  return;
}

Assistant:

void DWARFDebugMacro::dump(raw_ostream &OS) const {
  unsigned IndLevel = 0;
  for (const auto &Macros : MacroLists) {
    for (const Entry &E : Macros) {
      // There should not be DW_MACINFO_end_file when IndLevel is Zero. However,
      // this check handles the case of corrupted ".debug_macinfo" section.
      if (IndLevel > 0)
        IndLevel -= (E.Type == DW_MACINFO_end_file);
      // Print indentation.
      for (unsigned I = 0; I < IndLevel; I++)
        OS << "  ";
      IndLevel += (E.Type == DW_MACINFO_start_file);

      WithColor(OS, HighlightColor::Macro).get() << MacinfoString(E.Type);
      switch (E.Type) {
      default:
        // Got a corrupted ".debug_macinfo" section (invalid macinfo type).
        break;
      case DW_MACINFO_define:
      case DW_MACINFO_undef:
        OS << " - lineno: " << E.Line;
        OS << " macro: " << E.MacroStr;
        break;
      case DW_MACINFO_start_file:
        OS << " - lineno: " << E.Line;
        OS << " filenum: " << E.File;
        break;
      case DW_MACINFO_end_file:
        break;
      case DW_MACINFO_vendor_ext:
        OS << " - constant: " << E.ExtConstant;
        OS << " string: " << E.ExtStr;
        break;
      }
      OS << "\n";
    }
    OS << "\n";
  }
}